

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3813::ChElementHexaANCF_3813(ChElementHexaANCF_3813 *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  
  (this->super_ChElementGeneric).Kmatr.super_ChKblock._vptr_ChKblock =
       (_func_int **)&PTR__ChKblockGeneric_00b62688;
  auVar1 = ZEXT816(0) << 0x40;
  auVar2 = ZEXT1632(auVar1);
  (this->super_ChElementGeneric).Kmatr.K = (ChMatrixDynamic<double>)auVar2._0_24_;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar2._24_8_;
  *(undefined1 (*) [32])
   &(this->super_ChElementGeneric).Kmatr.K.
    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = auVar2;
  (this->super_ChElementHexahedron)._vptr_ChElementHexahedron = (_func_int **)0xb5d290;
  (this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase = (_func_int **)0xb5d378;
  this->super_ChLoadableUVW = (ChLoadableUVW)0xb5d4a0;
  (this->m_InertFlexVec).m_data[0] = 0.0;
  (this->m_InertFlexVec).m_data[1] = 0.0;
  (this->m_InertFlexVec).m_data[2] = 0.0;
  this->m_flag_HE = ANALYTICAL;
  this->m_nodes =
       (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
        )SUB3224(ZEXT1632(auVar1),0);
  (this->m_Material).super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)SUB328(ZEXT1632(auVar1),0x18);
  (this->m_Material).super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ::resize(&this->m_nodes,8);
  return;
}

Assistant:

ChElementHexaANCF_3813::ChElementHexaANCF_3813() : m_flag_HE(ANALYTICAL) {
    m_nodes.resize(8);
}